

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  RepeatedPtrFieldBase **v1;
  RepeatedPtrFieldBase **v2;
  char *failure_msg;
  LogMessage *pLVar5;
  MessageLite *pMVar6;
  Rep *pRVar7;
  string_view sVar8;
  LogMessage local_138;
  Voidify local_121;
  ClassData *local_120;
  TypeId local_118;
  byte local_109;
  LogMessage local_108;
  Voidify local_f1;
  Arena *local_f0;
  Arena *arena;
  int recycled;
  Voidify local_c9;
  MessageLite *local_c8;
  MessageLite *prototype;
  MessageLite **end;
  MessageLite **src;
  MessageLite **dst;
  int new_size;
  Voidify local_8d [13];
  LogMessage local_80;
  Voidify local_69;
  RepeatedPtrFieldBase *local_68;
  RepeatedPtrFieldBase *local_60;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *from_local;
  RepeatedPtrFieldBase *this_local;
  ulong local_38;
  size_t line;
  long local_28;
  void *prefetch_ptr;
  ptrdiff_t offset;
  RepeatedPtrFieldBase *local_10;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
    offset = local_38;
    prefetch_ptr = (void *)(local_38 * 0x40 + 0x40);
    local_28 = (long)from + (long)prefetch_ptr;
    local_10 = from;
  }
  local_60 = from;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from;
  from_local = this;
  this_local = from;
  line = (size_t)from;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::RepeatedPtrFieldBase_const*>(&local_60);
  local_68 = this;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::RepeatedPtrFieldBase*>(&local_68);
  local_58 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::internal::RepeatedPtrFieldBase_const*,google::protobuf::internal::RepeatedPtrFieldBase*>
                       (v1,v2,"&from != this");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0xe0,failure_msg);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  dst._7_1_ = 0;
  if (*(int *)(absl_log_internal_check_op_result + 8) < 1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&new_size,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0xe1,"from.current_size_ > 0");
    dst._7_1_ = 1;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&new_size);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_8d,pLVar5);
  }
  if ((dst._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&new_size);
  }
  dst._0_4_ = this->current_size_ + *(int *)(absl_log_internal_check_op_result + 8);
  src = (MessageLite **)InternalReserve(this,(int)dst);
  end = (MessageLite **)elements((RepeatedPtrFieldBase *)absl_log_internal_check_op_result);
  prototype = (MessageLite *)(end + *(int *)(absl_log_internal_check_op_result + 8));
  local_c8 = *end;
  arena._7_1_ = 0;
  if (local_c8 == (MessageLite *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&recycled,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
               ,0xe7,"prototype != nullptr");
    arena._7_1_ = 1;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&recycled);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar5);
  }
  if ((arena._7_1_ & 1) == 0) {
    iVar3 = ClearedCount(this);
    if (0 < iVar3) {
      arena._0_4_ = MergeIntoClearedMessages
                              (this,(RepeatedPtrFieldBase *)absl_log_internal_check_op_result);
      src = src + (int)arena;
      end = end + (int)arena;
    }
    local_f0 = GetArena(this);
    while( true ) {
      if (prototype <= end) {
        ExchangeCurrentSize(this,(int)dst);
        iVar3 = (int)dst;
        iVar4 = allocated_size(this);
        iVar1 = (int)dst;
        if (iVar4 < iVar3) {
          pRVar7 = rep(this);
          pRVar7->allocated_size = iVar1;
        }
        return;
      }
      local_109 = 0;
      if (*end == (MessageLite *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                   ,0xef,"*src != nullptr");
        local_109 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_108);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_f1,pLVar5);
      }
      if ((local_109 & 1) != 0) break;
      local_118 = TypeId::Get(*end);
      local_120 = (ClassData *)TypeId::Get(local_c8);
      bVar2 = protobuf::operator==(local_118,(TypeId)local_120);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                   ,0xf0,"TypeId::Get(**src) == TypeId::Get(*prototype)");
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_138);
        sVar8 = MessageLite::GetTypeName(*end);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,sVar8);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar5,(char (*) [5])" vs ");
        sVar8 = MessageLite::GetTypeName(local_c8);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,sVar8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_121,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_138);
      }
      pMVar6 = MessageLite::New(local_c8,local_f0);
      *src = pMVar6;
      MessageLite::CheckTypeAndMergeFrom(*src,*end);
      end = end + 1;
      src = src + 1;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_108);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&recycled);
}

Assistant:

void RepeatedPtrFieldBase::MergeFrom<MessageLite>(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  ABSL_DCHECK_NE(&from, this);
  ABSL_DCHECK(from.current_size_ > 0);
  int new_size = current_size_ + from.current_size_;
  auto dst = reinterpret_cast<MessageLite**>(InternalReserve(new_size));
  auto src = reinterpret_cast<MessageLite const* const*>(from.elements());
  auto end = src + from.current_size_;
  const MessageLite* prototype = src[0];
  ABSL_DCHECK(prototype != nullptr);
  if (ABSL_PREDICT_FALSE(ClearedCount() > 0)) {
    int recycled = MergeIntoClearedMessages(from);
    dst += recycled;
    src += recycled;
  }
  Arena* arena = GetArena();
  for (; src < end; ++src, ++dst) {
    ABSL_DCHECK(*src != nullptr);
    ABSL_DCHECK(TypeId::Get(**src) == TypeId::Get(*prototype))
        << (**src).GetTypeName() << " vs " << prototype->GetTypeName();
    *dst = prototype->New(arena);
    (*dst)->CheckTypeAndMergeFrom(**src);
  }
  ExchangeCurrentSize(new_size);
  if (new_size > allocated_size()) {
    rep()->allocated_size = new_size;
  }
}